

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::SetElementIOnTaggedNumber
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  Var object_00;
  RecyclableObject *receiver_00;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  PropertyRecord *pPStack_48;
  IndexType indexType;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *requestContext_local;
  Var value_local;
  Var index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  propertyRecord._4_4_ = propertyOperationFlags;
  _indexVal = requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local = index;
  index_local = object;
  object_local = (RecyclableObject *)receiver;
  bVar2 = TaggedNumber::Is(receiver);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xff5,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  propertyRecord._0_4_ = 0;
  pPStack_48 = (PropertyRecord *)0x0;
  IVar3 = GetIndexType(&value_local,_indexVal,(uint32 *)&propertyRecord,&stack0xffffffffffffffb8,
                       true);
  receiver_00 = object_local;
  object_00 = index_local;
  if (IVar3 == IndexType_Number) {
    iVar4 = SetItemOnTaggedNumber
                      (object_local,(RecyclableObject *)index_local,(uint32)propertyRecord,
                       requestContext_local,_indexVal,propertyRecord._4_4_);
  }
  else {
    propertyId = PropertyRecord::GetPropertyId(pPStack_48);
    iVar4 = SetPropertyOnTaggedNumber
                      (receiver_00,(RecyclableObject *)object_00,propertyId,requestContext_local,
                       _indexVal,propertyRecord._4_4_);
  }
  receiver_local._7_1_ = iVar4 != 0;
  return receiver_local._7_1_;
}

Assistant:

bool JavascriptOperators::SetElementIOnTaggedNumber(
        _In_ Var receiver,
        _In_ RecyclableObject* object,
        _In_ Var index,
        _In_ Var value,
        _In_ ScriptContext* requestContext,
        _In_ PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, requestContext, &indexVal, &propertyRecord, true);
        if (indexType == IndexType_Number)
        {
            return  JavascriptOperators::SetItemOnTaggedNumber(receiver, object, indexVal, value, requestContext, propertyOperationFlags);
        }
        else
        {
            return  JavascriptOperators::SetPropertyOnTaggedNumber(receiver, object, propertyRecord->GetPropertyId(), value, requestContext, propertyOperationFlags);
        }
    }